

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebServer.cpp
# Opt level: O1

void __thiscall WebServer::run(WebServer *this)

{
  ThreadPool *this_00;
  code *pcVar1;
  code *pcVar2;
  _Head_base<0UL,_WebServer_*,_false> _Var3;
  code *pcVar4;
  undefined1 auVar5 [8];
  Task task;
  code *local_c8;
  code *pcStack_c0;
  _Head_base<0UL,_WebServer_*,_false> local_b8;
  _Any_data local_a8;
  WebServer *local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_80;
  undefined1 local_78 [8];
  code *pcStack_70;
  _Head_base<0UL,_WebServer_*,_false> local_68;
  _Any_data local_60;
  code *local_50;
  undefined8 local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  local_c8 = (code *)0x0;
  pcStack_c0 = (code *)0x0;
  local_b8._M_head_impl = (WebServer *)0x0;
  do {
    _Var3._M_head_impl = local_b8._M_head_impl;
    pcVar2 = pcStack_c0;
    pcVar1 = local_c8;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"wait request",0xc);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
    std::ostream::put('\0');
    std::ostream::flush();
    handleEvents((vector<std::shared_ptr<HttpData>,_std::allocator<std::shared_ptr<HttpData>_>_> *)
                 local_78,this);
    pcVar4 = pcStack_70;
    auVar5 = local_78;
    local_c8 = (code *)local_78;
    pcStack_c0 = pcStack_70;
    local_b8._M_head_impl = local_68._M_head_impl;
    local_98 = _Var3._M_head_impl;
    local_a8._M_unused._M_object = pcVar1;
    local_a8._8_8_ = pcVar2;
    local_78 = (undefined1  [8])0x0;
    pcStack_70 = (code *)0x0;
    local_68._M_head_impl = (WebServer *)0x0;
    std::vector<std::shared_ptr<HttpData>,_std::allocator<std::shared_ptr<HttpData>_>_>::~vector
              ((vector<std::shared_ptr<HttpData>,_std::allocator<std::shared_ptr<HttpData>_>_> *)
               &local_a8);
    std::vector<std::shared_ptr<HttpData>,_std::allocator<std::shared_ptr<HttpData>_>_>::~vector
              ((vector<std::shared_ptr<HttpData>,_std::allocator<std::shared_ptr<HttpData>_>_> *)
               local_78);
    for (; auVar5 != (undefined1  [8])pcVar4; auVar5 = (undefined1  [8])((long)auVar5 + 0x10)) {
      local_88 = 0;
      _Stack_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_98 = (WebServer *)0x0;
      uStack_90 = 0;
      local_a8._M_unused._M_object = (code *)0x0;
      local_a8._8_8_ = (code *)0x0;
      local_78 = (undefined1  [8])do_request;
      pcStack_70 = (code *)0x0;
      local_68._M_head_impl = this;
      std::function<void(std::shared_ptr<void>)>::operator=
                ((function<void(std::shared_ptr<void>)> *)local_a8._M_pod_data,
                 (_Bind<void_(WebServer::*(WebServer_*,_std::_Placeholder<1>))(std::shared_ptr<void>)>
                  *)local_78);
      local_88 = *(undefined8 *)auVar5;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&_Stack_80,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)auVar5 + 8));
      this_00 = (this->threadPool_).super___shared_ptr<ThreadPool,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      std::function<void_(std::shared_ptr<void>)>::function
                ((function<void_(std::shared_ptr<void>)> *)&local_60,
                 (function<void_(std::shared_ptr<void>)> *)&local_a8);
      local_40 = local_88;
      local_38 = _Stack_80._M_pi;
      if (_Stack_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (_Stack_80._M_pi)->_M_use_count = (_Stack_80._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (_Stack_80._M_pi)->_M_use_count = (_Stack_80._M_pi)->_M_use_count + 1;
        }
      }
      ThreadPool::appendTask(this_00,(Task *)&local_60);
      if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
      }
      if (local_50 != (code *)0x0) {
        (*local_50)(&local_60,&local_60,__destroy_functor);
      }
      if (_Stack_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_80._M_pi);
      }
      if (local_98 != (WebServer *)0x0) {
        (*(code *)local_98)(&local_a8,&local_a8,3);
      }
    }
    TimerManager::tick(this->timerManager);
  } while( true );
}

Assistant:

void WebServer::run()
{

    std::vector<std::shared_ptr<HttpData>> epollInSocket;

    while (true)
    {
        std::cout << "wait request" << std::endl;

        epollInSocket = handleEvents();
        for (auto &it : epollInSocket)
        {
            Task task;
            task.function = std::bind(&WebServer::do_request, this, std::placeholders::_1);
            task.arg = it;
            threadPool_->appendTask(task);
        }
        /*每次处理完事件后就检查定时器*/
        timerManager->tick();
    }
}